

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue new_target;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  JSValueUnion JVar4;
  ulong uVar5;
  ulong uVar6;
  JSValueUnion JVar7;
  int64_t iVar8;
  JSValue JVar9;
  JSValue JVar10;
  JSValue v;
  JSValue JVar11;
  JSValue this_obj;
  ulong local_b0;
  JSValueUnion local_a8;
  int64_t local_80;
  JSValue local_68;
  ulong local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  uVar1 = js_typed_array_get_length_internal(ctx,this_val);
  iVar8 = 3;
  if (-1 < (int)uVar1) {
    JVar9 = *argv;
    iVar2 = check_function(ctx,*argv);
    if (iVar2 == 0) {
      if (argc < 2) {
        local_80 = 3;
        uVar3 = 0;
        local_b0 = 0;
      }
      else {
        local_80 = argv[1].tag;
        local_b0 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
        uVar3 = (ulong)argv[1].u.ptr & 0xffffffff;
      }
      if (uVar1 != 0) {
        uVar5 = 1;
        if (1 < (int)uVar1) {
          uVar5 = (ulong)uVar1;
        }
        uVar6 = 0;
        do {
          JVar11.tag = 0;
          JVar11.u.ptr = (void *)uVar6;
          v = JS_GetPropertyValue(ctx,this_val,JVar11);
          iVar8 = v.tag;
          JVar4 = v.u;
          uVar1 = (uint)v.tag;
          if (uVar1 == 6) {
LAB_0016f3e6:
            uVar5 = (ulong)JVar4.ptr & 0xffffffff00000000;
            uVar3 = (ulong)JVar4.ptr & 0xffffffff;
            goto LAB_0016f20f;
          }
          local_50 = 0;
          local_a8.float64 = local_a8.float64 & 0xffffffff00000000;
          new_target.tag = 3;
          new_target.u.ptr = local_a8.ptr;
          this_obj.tag = local_80;
          this_obj.u.ptr = (void *)(local_b0 | uVar3);
          local_68 = v;
          local_58 = uVar6;
          local_48 = this_val.u;
          local_40 = this_val.tag;
          JVar11 = JS_CallInternal(ctx,JVar9,this_obj,new_target,3,&local_68,2);
          if ((int)JVar11.tag == 6) goto LAB_0016f3e6;
          iVar2 = JS_ToBoolFree(ctx,JVar11);
          if (iVar2 != 0) {
            if (findIndex == 0) {
              JVar4.float64 = JVar4.float64 & 0xffffffff00000000;
            }
            else {
              if ((0xfffffff4 < uVar1) &&
                 (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
                __JS_FreeValueRT(ctx->rt,v);
              }
              JVar4.float64 = 0.0;
              v.tag = 0;
              v.u.ptr = (void *)uVar6;
            }
            goto LAB_0016f24a;
          }
          if ((0xfffffff4 < uVar1) &&
             (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,v);
          }
          uVar6 = uVar6 + 1;
          local_a8 = JVar4;
        } while (uVar5 != uVar6);
      }
      JVar4.float64 = 0.0;
      JVar7.float64 = 2.12199579047121e-314;
      if (findIndex == 0) {
        JVar7.float64 = JVar4.float64;
      }
      v.tag = (ulong)(findIndex == 0) * 3;
      v.u.float64 = JVar7.float64;
      goto LAB_0016f24a;
    }
  }
  uVar3 = 0;
  uVar5 = 0;
LAB_0016f20f:
  JVar4.ptr = (void *)(uVar3 | uVar5);
  if ((0xfffffff4 < (uint)iVar8) && (iVar2 = *JVar4.ptr, *(int *)JVar4.ptr = iVar2 + -1, iVar2 < 2))
  {
    JVar9.tag = iVar8;
    JVar9.u.ptr = JVar4.ptr;
    __JS_FreeValueRT(ctx->rt,JVar9);
  }
  v = (JSValue)(ZEXT816(6) << 0x40);
  JVar4.float64 = 0.0;
LAB_0016f24a:
  JVar10.u.float64 = (ulong)v.u.ptr & 0xffffffff | JVar4.float64;
  JVar10.tag = v.tag;
  return JVar10;
}

Assistant:

static JSValue js_typed_array_find(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue val, index_val, res;
    int len, k;

    val = JS_UNDEFINED;
    len = js_typed_array_get_length_internal(ctx, this_val);
    if (len < 0)
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt32(ctx, k);
        val = JS_GetPropertyValue(ctx, this_val, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                return index_val;
            } else {
                return val;
            }
        }
        JS_FreeValue(ctx, val);
    }
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}